

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.c++
# Opt level: O0

Maybe<kj::Own<const_kj::File,_std::nullptr_t>_> __thiscall
kj::anon_unknown_59::InMemoryDirectory::tryOpenFile
          (InMemoryDirectory *this,PathPtr path,WriteMode mode)

{
  bool bVar1;
  size_t sVar2;
  Impl *pIVar3;
  String *pSVar4;
  Own<const_kj::Directory,_std::nullptr_t> *pOVar5;
  Directory *pDVar6;
  undefined4 in_register_0000000c;
  File *extraout_RDX;
  File *extraout_RDX_00;
  File *extraout_RDX_01;
  File *extraout_RDX_02;
  File *extraout_RDX_03;
  File *pFVar7;
  WriteMode in_R8D;
  StringPtr name;
  StringPtr name_00;
  PathPtr PVar8;
  Maybe<kj::Own<const_kj::File,_std::nullptr_t>_> MVar9;
  Own<const_kj::Directory,_std::nullptr_t> *child;
  WriteMode local_d0;
  undefined1 local_c8 [16];
  undefined1 local_b8 [8];
  OwnOwn<const_kj::Directory,_std::nullptr_t> _child1153;
  EntryImpl *entry;
  WriteMode local_90;
  undefined1 local_88 [16];
  EntryImpl *_entry1147;
  undefined1 local_70 [8];
  Locked<kj::(anonymous_namespace)::InMemoryDirectory::Impl> lock;
  Fault local_58;
  Fault f_1;
  Fault local_38;
  Fault f;
  WriteMode mode_local;
  InMemoryDirectory *this_local;
  PathPtr path_local;
  
  path_local.parts.ptr = (String *)CONCAT44(in_register_0000000c,mode);
  this_local = (InMemoryDirectory *)path.parts.size_;
  name_00.content.ptr = (Locked<kj::(anonymous_namespace)::InMemoryDirectory::Impl> *)path.parts.ptr
  ;
  f.exception._4_4_ = in_R8D;
  path_local.parts.size_ = (size_t)this;
  sVar2 = PathPtr::size((PathPtr *)&this_local);
  if (sVar2 == 0) {
    bVar1 = has<kj::WriteMode,void>(f.exception._4_4_,MODIFY);
    if (bVar1) {
      kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[11]>
                (&local_38,
                 "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/filesystem.c++"
                 ,0x473,FAILED,(char *)0x0,"\"not a file\"",(char (*) [11])"not a file");
      Maybe<kj::Own<const_kj::File,_std::nullptr_t>_>::Maybe
                ((Maybe<kj::Own<const_kj::File,_std::nullptr_t>_> *)this);
      kj::_::Debug::Fault::~Fault(&local_38);
      pFVar7 = extraout_RDX;
    }
    else {
      bVar1 = has<kj::WriteMode,void>(f.exception._4_4_,CREATE);
      if (bVar1) {
        Maybe<kj::Own<const_kj::File,_std::nullptr_t>_>::Maybe
                  ((Maybe<kj::Own<const_kj::File,_std::nullptr_t>_> *)this);
        pFVar7 = extraout_RDX_00;
      }
      else {
        kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[19]>
                  (&local_58,
                   "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/filesystem.c++"
                   ,0x477,FAILED,(char *)0x0,"\"can\'t replace self\"",
                   (char (*) [19])"can\'t replace self");
        Maybe<kj::Own<const_kj::File,_std::nullptr_t>_>::Maybe
                  ((Maybe<kj::Own<const_kj::File,_std::nullptr_t>_> *)this);
        kj::_::Debug::Fault::~Fault(&local_58);
        pFVar7 = extraout_RDX_01;
      }
    }
  }
  else {
    sVar2 = PathPtr::size((PathPtr *)&this_local);
    if (sVar2 == 1) {
      MutexGuarded<kj::(anonymous_namespace)::InMemoryDirectory::Impl>::lockExclusive
                ((MutexGuarded<kj::(anonymous_namespace)::InMemoryDirectory::Impl> *)local_70,
                 &name_00.content.ptr[1].ptr);
      pIVar3 = Locked<kj::(anonymous_namespace)::InMemoryDirectory::Impl>::operator->
                         ((Locked<kj::(anonymous_namespace)::InMemoryDirectory::Impl> *)local_70);
      pSVar4 = PathPtr::operator[]((PathPtr *)&this_local,0);
      StringPtr::StringPtr((StringPtr *)&entry,pSVar4);
      name.content.size_ = (size_t)entry;
      name.content.ptr = (char *)pIVar3;
      Impl::openEntry((Impl *)local_88,name,local_90);
      local_88._8_8_ =
           kj::_::readMaybe<kj::(anonymous_namespace)::InMemoryDirectory::EntryImpl>
                     ((Maybe<kj::(anonymous_namespace)::InMemoryDirectory::EntryImpl_&> *)local_88);
      if ((EntryImpl *)local_88._8_8_ == (EntryImpl *)0x0) {
        Maybe<kj::Own<const_kj::File,_std::nullptr_t>_>::Maybe
                  ((Maybe<kj::Own<const_kj::File,_std::nullptr_t>_> *)this);
      }
      else {
        asFile(this,name_00.content.ptr,(EntryImpl *)local_70,(WriteMode)local_88._8_8_);
      }
      _child1153.value.ptr._4_4_ = 1;
      Locked<kj::(anonymous_namespace)::InMemoryDirectory::Impl>::~Locked
                ((Locked<kj::(anonymous_namespace)::InMemoryDirectory::Impl> *)local_70);
      pFVar7 = extraout_RDX_02;
    }
    else {
      pSVar4 = PathPtr::operator[]((PathPtr *)&this_local,0);
      StringPtr::StringPtr((StringPtr *)&child,pSVar4);
      name_00.content.size_ = (size_t)child;
      tryGetParent((InMemoryDirectory *)local_c8,name_00,local_d0);
      kj::_::readMaybe<kj::Directory_const,decltype(nullptr)>
                ((_ *)local_b8,(Maybe<kj::Own<const_kj::Directory,_std::nullptr_t>_> *)local_c8);
      Maybe<kj::Own<const_kj::Directory,_std::nullptr_t>_>::~Maybe
                ((Maybe<kj::Own<const_kj::Directory,_std::nullptr_t>_> *)local_c8);
      pOVar5 = kj::_::OwnOwn::operator_cast_to_Own_((OwnOwn *)local_b8);
      if (pOVar5 == (Own<const_kj::Directory,_std::nullptr_t> *)0x0) {
        Maybe<kj::Own<const_kj::File,_std::nullptr_t>_>::Maybe
                  ((Maybe<kj::Own<const_kj::File,_std::nullptr_t>_> *)this);
      }
      else {
        pOVar5 = kj::_::OwnOwn<const_kj::Directory,_std::nullptr_t>::operator*
                           ((OwnOwn<const_kj::Directory,_std::nullptr_t> *)local_b8);
        pDVar6 = Own<const_kj::Directory,_std::nullptr_t>::operator->(pOVar5);
        sVar2 = PathPtr::size((PathPtr *)&this_local);
        PVar8 = PathPtr::slice((PathPtr *)&this_local,1,sVar2);
        (*(pDVar6->super_ReadableDirectory).super_FsNode._vptr_FsNode[0xd])
                  (this,pDVar6,PVar8.parts.ptr,PVar8.parts.size_,(ulong)f.exception._4_4_);
      }
      _child1153.value.ptr._4_4_ = 1;
      kj::_::OwnOwn<const_kj::Directory,_std::nullptr_t>::~OwnOwn
                ((OwnOwn<const_kj::Directory,_std::nullptr_t> *)local_b8);
      pFVar7 = extraout_RDX_03;
    }
  }
  MVar9.ptr.ptr = pFVar7;
  MVar9.ptr.disposer = (Disposer *)this;
  return (Maybe<kj::Own<const_kj::File,_std::nullptr_t>_>)MVar9.ptr;
}

Assistant:

Maybe<Own<const File>> tryOpenFile(PathPtr path, WriteMode mode) const override {
    if (path.size() == 0) {
      if (has(mode, WriteMode::MODIFY)) {
        KJ_FAIL_REQUIRE("not a file") { return kj::none; }
      } else if (has(mode, WriteMode::CREATE)) {
        return kj::none;  // already exists (as a directory)
      } else {
        KJ_FAIL_REQUIRE("can't replace self") { return kj::none; }
      }
    } else if (path.size() == 1) {
      auto lock = impl.lockExclusive();
      KJ_IF_SOME(entry, lock->openEntry(path[0], mode)) {
        return asFile(lock, entry, mode);
      } else {
        return kj::none;
      }
    }